

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::detail::ResultBuilder::binary_assert<0,supermap::Key<2ul>,supermap::Key<2ul>>
          (ResultBuilder *this,Key<2UL> *lhs,Key<2UL> *rhs)

{
  bool bVar1;
  ContextOptions *pCVar2;
  Key<2UL> *in_R8;
  String SStack_38;
  
  bVar1 = std::operator==(&lhs->super_array<unsigned_char,_2UL>,
                          &rhs->super_array<unsigned_char,_2UL>);
  (this->super_AssertData).m_failed = !bVar1;
  if ((bVar1) && (pCVar2 = getContextOptions(), pCVar2->success != true)) {
    return;
  }
  stringifyBinaryExpr<supermap::Key<2ul>,supermap::Key<2ul>>
            (&SStack_38,(detail *)lhs,(Key<2UL> *)0x1a184a,(char *)rhs,in_R8);
  String::operator=(&(this->super_AssertData).m_decomp,&SStack_38);
  String::~String(&SStack_38);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }